

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

void __thiscall TextBuffer::Snapshot::~Snapshot(Snapshot *this)

{
  Layer *pLVar1;
  uint32_t uVar2;
  
  pLVar1 = this->layer;
  if (pLVar1->snapshot_count != 0) {
    pLVar1->snapshot_count = pLVar1->snapshot_count - 1;
    uVar2 = this->base_layer->snapshot_count - 1;
    this->base_layer->snapshot_count = uVar2;
    if ((pLVar1->snapshot_count == 0) || (uVar2 == 0)) {
      consolidate_layers(this->buffer);
    }
    return;
  }
  __assert_fail("layer.snapshot_count > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/superstring/src/core/text-buffer.cc"
                ,0x438,"TextBuffer::Snapshot::~Snapshot()");
}

Assistant:

TextBuffer::Snapshot::~Snapshot() {
  assert(layer.snapshot_count > 0);
  layer.snapshot_count--;
  base_layer.snapshot_count--;
  if (layer.snapshot_count == 0 || base_layer.snapshot_count == 0) {
    buffer.consolidate_layers();
  }
}